

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMDP.cpp
# Opt level: O0

double __thiscall QMDP::GetQNoCache(QMDP *this,Index jaohI,Index jaI)

{
  Index IVar1;
  JointBeliefInterface *pJVar2;
  undefined4 in_EDX;
  long *in_RDI;
  double dVar3;
  LIndex unaff_retaddr;
  PlanningUnitMADPDiscrete *in_stack_00000008;
  double q;
  JointBeliefInterface *jb;
  Index t;
  LIndex in_stack_00000060;
  PlanningUnitMADPDiscrete *in_stack_00000068;
  
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xa0)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0xa0));
  IVar1 = PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(in_stack_00000008,unaff_retaddr);
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0xa0)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0xa0));
  pJVar2 = PlanningUnitMADPDiscrete::GetJointBeliefInterface(in_stack_00000068,in_stack_00000060);
  dVar3 = (double)(**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],IVar1,pJVar2,in_EDX);
  if (pJVar2 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*pJVar2 + 8))();
  }
  return dVar3;
}

Assistant:

double QMDP::GetQNoCache(Index jaohI, Index jaI) const
{
    Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
    JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
    double q = _m_p->GetQ (t, *jb, jaI);
    delete jb;
    return( q );
}